

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

iterator * __thiscall pybind11::detail::values_and_holders::iterator::operator++(iterator *this)

{
  size_t *psVar1;
  type_info **pptVar2;
  
  if ((this->inst->field_0x30 & 2) == 0) {
    pptVar2 = (this->typeit)._M_current;
    (this->curr).vh = (this->curr).vh + (*pptVar2)->holder_size_in_ptrs + 1;
    (this->typeit)._M_current = pptVar2 + 1;
    (this->curr).type = pptVar2[1];
  }
  psVar1 = &(this->curr).index;
  *psVar1 = *psVar1 + 1;
  return this;
}

Assistant:

iterator &operator++() {
            if (!inst->simple_layout) {
                curr.vh += 1 + (*typeit)->holder_size_in_ptrs;
                curr.type = *(++typeit);
            }
            ++curr.index;
            return *this;
        }